

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath __thiscall testing::internal::FilePath::RemoveTrailingPathSeparator(FilePath *this)

{
  bool bVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  String *in_RSI;
  FilePath FVar3;
  String local_20;
  
  bVar1 = IsDirectory((FilePath *)in_RSI);
  if (bVar1) {
    String::ConstructNonNull(&local_20,in_RSI->c_str_,in_RSI->length_ - 1);
    FilePath(this,&local_20);
    String::~String(&local_20);
    sVar2 = extraout_RDX;
  }
  else {
    String::String(&this->pathname_,in_RSI);
    sVar2 = extraout_RDX_00;
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory()
      ? FilePath(String(pathname_.c_str(), pathname_.length() - 1))
      : *this;
}